

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapping.h
# Opt level: O0

void __thiscall wasm::TrappingFunctionContainer::addToModule(TrappingFunctionContainer *this)

{
  bool bVar1;
  reference ppVar2;
  type *ppFVar3;
  type *func_1;
  type *__1;
  _Self local_58;
  iterator __end3_1;
  iterator __begin3_1;
  map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *__range3_1;
  type *func;
  type *_;
  _Self local_28;
  iterator __end3;
  iterator __begin3;
  map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *__range3;
  TrappingFunctionContainer *this_local;
  
  if ((this->immediate & 1U) == 0) {
    __end3 = std::
             map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
             ::begin(&this->functions);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
         ::end(&this->functions);
    while (bVar1 = std::operator!=(&__end3,&local_28), bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Function_*>_>::operator*
                         (&__end3);
      std::get<0ul,wasm::Name_const,wasm::Function*>(ppVar2);
      ppFVar3 = std::get<1ul,wasm::Name_const,wasm::Function*>(ppVar2);
      Module::addFunction(this->wasm,*ppFVar3);
      std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Function_*>_>::operator++(&__end3);
    }
    __end3_1 = std::
               map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
               ::begin(&this->imports);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
         ::end(&this->imports);
    while (bVar1 = std::operator!=(&__end3_1,&local_58), bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Function_*>_>::operator*
                         (&__end3_1);
      std::get<0ul,wasm::Name_const,wasm::Function*>(ppVar2);
      ppFVar3 = std::get<1ul,wasm::Name_const,wasm::Function*>(ppVar2);
      Module::addFunction(this->wasm,*ppFVar3);
      std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Function_*>_>::operator++(&__end3_1);
    }
  }
  std::
  map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::clear(&this->functions);
  std::
  map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::clear(&this->imports);
  return;
}

Assistant:

void addToModule() {
    if (!immediate) {
      for (auto& [_, func] : functions) {
        wasm.addFunction(func);
      }
      for (auto& [_, func] : imports) {
        wasm.addFunction(func);
      }
    }
    functions.clear();
    imports.clear();
  }